

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::InsertTypeTransitionsAtPotentialKills(BackwardPass *this)

{
  SymID SVar1;
  SymID symId;
  Instr *this_00;
  BasicBlock *pBVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Type *pTVar6;
  BackwardPass *this_01;
  PropertySym *pPVar7;
  AddPropertyCacheBucket *data;
  HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *pHVar8;
  BackwardPass *this_02;
  JITTypeHolderBase<void> local_78;
  JITTypeHolderBase<void> local_70;
  BasicBlock *local_68;
  BackwardPass *local_60;
  undefined4 *local_58;
  undefined1 local_50 [24];
  JitArenaAllocator *local_38;
  
  this_00 = this->currentInstr;
  local_60 = this;
  if (((this_00->field_0x38 & 0x10) == 0) && (this_00->m_opcode != UpdateNewScObjectCache)) {
    this_01 = (BackwardPass *)IR::Instr::GetPropertySymOpnd(this_00);
    if ((this_01 != (BackwardPass *)0x0) &&
       (bVar4 = IR::PropertySymOpnd::IsObjectHeaderInlined((PropertySymOpnd *)this_01), bVar4)) {
      pPVar7 = Sym::AsPropertySym((Sym *)this_01->tempAlloc);
      pBVar2 = local_60->currentBlock;
      pHVar8 = pBVar2->stackSymToFinalType;
      if (pHVar8 != (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) {
        SVar1 = (pPVar7->m_stackSym->super_Sym).m_id;
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        local_58 = puVar5;
        for (local_68 = (BasicBlock *)0x0; local_68 < (BasicBlock *)(ulong)pHVar8->tableSize;
            local_68 = (BasicBlock *)((long)&local_68->next + 1)) {
          local_50._16_8_ = pHVar8->table + (long)local_68;
          local_38 = (JitArenaAllocator *)local_50._16_8_;
LAB_003cb4b1:
          if (local_38 == (JitArenaAllocator *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) {
LAB_003cb5fa:
              pcVar3 = (code *)invalidInstructionException();
              (*pcVar3)();
            }
            *puVar5 = 0;
          }
          local_38 = (JitArenaAllocator *)
                     (local_38->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_Allocator.outOfMemoryFunc;
          if (local_38 != (JitArenaAllocator *)local_50._16_8_) {
            pTVar6 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                     Iterator::Data((Iterator *)(local_50 + 0x10));
            local_50._0_8_ = (pTVar6->element).initialType.t;
            local_50._8_8_ = (GlobOpt *)0x0;
            bVar4 = JITTypeHolderBase<void>::operator!=
                              ((JITTypeHolderBase<void> *)local_50,(nullptr_t *)(local_50 + 8));
            if (bVar4) {
              local_78.t = (pTVar6->element).initialType.t;
              local_70.t = (pTVar6->element).finalType.t;
              bVar4 = JITTypeHolderBase<void>::operator!=(&local_78,&local_70);
              if ((bVar4) && (symId = pTVar6->value, SVar1 != symId)) {
                this_02 = this_01;
                bVar4 = IR::PropertySymOpnd::NeedsMonoCheck((PropertySymOpnd *)this_01);
                if (bVar4) {
                  local_50._0_8_ = (pTVar6->element).initialType.t;
                  local_50._8_8_ = IR::PropertySymOpnd::GetType((PropertySymOpnd *)this_01);
                  this_02 = (BackwardPass *)local_50;
                  bVar4 = JITTypeHolderBase<void>::operator!=
                                    ((JITTypeHolderBase<void> *)this_02,
                                     (JITTypeHolderBase<void> *)(local_50 + 8));
                  puVar5 = local_58;
                  if (bVar4) goto LAB_003cb4b1;
                }
                puVar5 = local_58;
                bVar4 = TransitionUndoesObjectHeaderInlining(this_02,&pTVar6->element);
                if (bVar4) {
                  InsertTypeTransitionAfterInstr
                            (local_60,this_00,symId,&pTVar6->element,
                             local_60->currentBlock->upwardExposedUses);
                }
              }
            }
            goto LAB_003cb4b1;
          }
          pHVar8 = pBVar2->stackSymToFinalType;
        }
      }
    }
  }
  else {
    local_68 = this->currentBlock;
    pHVar8 = local_68->stackSymToFinalType;
    if (pHVar8 != (HashTable<AddPropertyCacheBucket,_Memory::ArenaAllocator> *)0x0) {
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (local_58 = (undefined4 *)0x0; local_58 < (undefined4 *)(ulong)pHVar8->tableSize;
          local_58 = (undefined4 *)((long)local_58 + 1)) {
        local_50._16_8_ = pHVar8->table + (long)local_58;
        local_38 = (JitArenaAllocator *)local_50._16_8_;
        while( true ) {
          if (local_38 == (JitArenaAllocator *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar5 = 1;
            bVar4 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SList.h"
                               ,0x76,"(current != nullptr)","current != nullptr");
            if (!bVar4) goto LAB_003cb5fa;
            *puVar5 = 0;
          }
          local_38 = (JitArenaAllocator *)
                     (local_38->super_ArenaAllocator).
                     super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>.
                     super_Allocator.outOfMemoryFunc;
          if (local_38 == (JitArenaAllocator *)local_50._16_8_) break;
          pTVar6 = SListBase<Bucket<AddPropertyCacheBucket>,_Memory::ArenaAllocator,_RealCount>::
                   Iterator::Data((Iterator *)(local_50 + 0x10));
          local_50._0_8_ = (pTVar6->element).initialType.t;
          local_50._8_8_ = (GlobOpt *)0x0;
          bVar4 = JITTypeHolderBase<void>::operator!=
                            ((JITTypeHolderBase<void> *)local_50,(nullptr_t *)(local_50 + 8));
          if (bVar4) {
            local_78.t = (pTVar6->element).initialType.t;
            local_70.t = (pTVar6->element).finalType.t;
            bVar4 = JITTypeHolderBase<void>::operator!=(&local_78,&local_70);
            if (bVar4) {
              InsertTypeTransitionAfterInstr
                        (local_60,this_00,pTVar6->value,&pTVar6->element,
                         local_60->currentBlock->upwardExposedUses);
            }
          }
        }
        pHVar8 = local_68->stackSymToFinalType;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::InsertTypeTransitionsAtPotentialKills()
{
    // Final types can't be pushed up past certain instructions.
    IR::Instr *instr = this->currentInstr;

    if (instr->HasBailOutInfo() || instr->m_opcode == Js::OpCode::UpdateNewScObjectCache)
    {
        // Final types can't be pushed up past a bailout point.
        // Insert any transitions called for by the current state of add-property buckets.
        // Also do this for ctor cache updates, to avoid putting a type in the ctor cache that extends past
        // the end of the ctor that the cache covers.
        this->ForEachAddPropertyCacheBucket([&](int symId, AddPropertyCacheBucket *data)->bool {
            this->InsertTypeTransitionAfterInstr(instr, symId, data, this->currentBlock->upwardExposedUses);
            return false;
        });
    }
    else
    {
        // If this is a load/store that expects an object-header-inlined type, don't push another sym's transition from
        // object-header-inlined to non-object-header-inlined type past it, because the two syms may be aliases.
        IR::PropertySymOpnd *propertySymOpnd = instr->GetPropertySymOpnd();
        if (propertySymOpnd && propertySymOpnd->IsObjectHeaderInlined())
        {
            SymID opndId = propertySymOpnd->m_sym->AsPropertySym()->m_stackSym->m_id;
            this->ForEachAddPropertyCacheBucket([&](int symId, AddPropertyCacheBucket *data)->bool {
                if ((SymID)symId == opndId)
                {
                    // This is the sym we're tracking. No aliasing to worry about.
                    return false;
                }
                if (propertySymOpnd->NeedsMonoCheck() && data->GetInitialType() != propertySymOpnd->GetType())
                {
                    // Type mismatch in a monomorphic case -- no aliasing.
                    return false;
                }
                if (this->TransitionUndoesObjectHeaderInlining(data))
                {
                    // We're transitioning from inlined to non-inlined, so we can't push it up any farther.
                    this->InsertTypeTransitionAfterInstr(instr, symId, data, this->currentBlock->upwardExposedUses);
                }
                return false;
            });
        }
    }
}